

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
::_reduce_column_by(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                    *this,Index target,Index source)

{
  uint uVar1;
  pointer pIVar2;
  long lVar3;
  undefined1 *puVar4;
  node_ptr plVar5;
  pointer p;
  pointer pEVar6;
  undefined8 *puVar7;
  uint uVar8;
  pointer p_1;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
  *targetColumn;
  anon_class_1_0_00000001 local_34;
  anon_class_1_0_00000001 local_33;
  anon_class_1_0_00000001 local_32;
  anon_class_1_0_00000001 local_31;
  anon_class_8_1_e4bd5e45 local_30;
  
  if ((this->reducedMatrixR_).
      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_false,_true>_>_>_>
      .rowSwapped_ == true) {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>
    ::_orderRows(&(this->reducedMatrixR_).
                  super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_false,_true>_>_>_>
                );
  }
  targetColumn = (this->reducedMatrixR_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + target;
  if ((this->reducedMatrixR_).
      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_false,_true>_>_>_>
      .rowSwapped_ == true) {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>
    ::_orderRows(&(this->reducedMatrixR_).
                  super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_false,_true>_>_>_>
                );
  }
  local_30.targetColumn = targetColumn;
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persist___persistence_matrix::Column_types)7,false,false,true,false,true>>__Matrix_column_tag_1u>_false>___1_>
            ((this->reducedMatrixR_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + source,targetColumn,&local_31,&local_30,
             &local_32,&local_33,&local_34);
  if ((this->mirrorMatrixU_).
      super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_false,_true>_>_>_>
      .rowSwapped_ == true) {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>
    ::_orderRows(&(this->mirrorMatrixU_).
                  super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_false,_true>_>_>_>
                );
  }
  pIVar2 = (this->mirrorMatrixU_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mirrorMatrixU_).
      super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_false,_true>_>_>_>
      .rowSwapped_ == true) {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>
    ::_orderRows(&(this->mirrorMatrixU_).
                  super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_false,_true>_>_>_>
                );
  }
  lVar3 = *(long *)&(this->mirrorMatrixU_).matrix_.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[target].column_.super_type.data_;
  if (lVar3 != 0) {
    uVar1 = *(uint *)(lVar3 + 0x10);
    puVar4 = *(undefined1 **)&pIVar2[source].column_.super_type.data_.root_plus_size_;
    uVar8 = 0xffffffff;
    if ((Column_support *)puVar4 != &pIVar2[source].column_ && puVar4 != (undefined1 *)0x0) {
      plVar5 = *(node_ptr *)((long)&pIVar2[source].column_.super_type.data_ + 8);
      if (plVar5 == (node_ptr)0x0) goto LAB_00114875;
      uVar8 = *(uint *)&plVar5[1].next_;
    }
    if (uVar1 <= uVar8) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = "The new row index has to be higher than the current pivot.";
      __cxa_throw(puVar7,&char_const*::typeinfo,0);
    }
    local_30.targetColumn._0_4_ = uVar1;
    pEVar6 = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>>
             ::construct<unsigned_int&>
                       ((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>>
                         *)pIVar2[source].entryPool_,(uint *)&local_30);
    if ((pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ ==
        (node_ptr)0x0) {
      plVar5 = *(node_ptr *)((long)&pIVar2[source].column_.super_type.data_ + 8);
      (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = plVar5;
      (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)&pIVar2[source].column_;
      *(pointer *)((long)&pIVar2[source].column_.super_type.data_ + 8) = pEVar6;
      plVar5->next_ = (node_ptr)pEVar6;
      return;
    }
    __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                  "/usr/include/boost/intrusive/list.hpp",0x33c,
                  "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, false, true>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, false, true>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
                 );
  }
LAB_00114875:
  __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, false, true>>::Matrix_column_tag, Type = 1]"
               );
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column_by(Index target, Index source)
{
  Column& curr = reducedMatrixR_.get_column(target);
  if constexpr (Master_matrix::Option_list::is_z2) {
    curr += reducedMatrixR_.get_column(source);
    // to avoid having to do line operations during vineyards, U is transposed
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.get_column(source).push_back(*mirrorMatrixU_.get_column(target).begin());
  } else {
    Column& toadd = reducedMatrixR_.get_column(source);
    Field_element coef = toadd.get_pivot_value();
    coef = operators_->get_inverse(coef);
    operators_->multiply_inplace(coef, operators_->get_characteristic() - curr.get_pivot_value());

    curr.multiply_source_and_add(toadd, coef);
    // but no transposition for Zp, careful if there will be vineyard or rep cycles in Zp one day
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.multiply_source_and_add_to(coef, source, target);
  }
}